

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t tar_read_header(archive_read *a,tar *tar,archive_entry *entry,size_t *unconsumed)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  archive_read *a_00;
  char *p;
  ssize_t sVar4;
  archive_read *in_RCX;
  size_t *unconsumed_00;
  tar *in_RDX;
  archive_read *in_RSI;
  tar *in_RDI;
  ssize_t bytes_read;
  wchar_t err2;
  archive_entry_header_gnutar *gnuheader;
  archive_entry_header_ustar *header;
  char *h;
  wchar_t err;
  ssize_t bytes;
  size_t *in_stack_ffffffffffffff98;
  archive_read *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  archive_read *in_stack_ffffffffffffffb0;
  archive_read *a_01;
  archive_read *h_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  tar *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  while( true ) {
    tar_flush_unconsumed(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    a_00 = (archive_read *)
           __archive_read_ahead
                     (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                      (ssize_t *)0x16292b);
    if ((long)in_stack_ffffffffffffffd0 < 0) {
      return (wchar_t)in_stack_ffffffffffffffd0;
    }
    if (in_stack_ffffffffffffffd0 == (tar *)0x0) {
      return L'\x01';
    }
    if ((long)in_stack_ffffffffffffffd0 < 0x200) {
      archive_set_error((archive *)in_RDI,0x54,"Truncated tar archive");
      return L'\xffffffe2';
    }
    (in_RCX->archive).magic = 0x200;
    (in_RCX->archive).state = 0;
    if (((char)(a_00->archive).magic != '\0') ||
       (wVar1 = archive_block_is_null((char *)a_00), wVar1 == L'\0')) break;
    if ((in_RDI->entry_pathname).s == (char *)0x0) {
      *(int *)&(in_RDI->acl_text).buffer_length = 0x30000;
      (in_RDI->entry_pathname).s = "tar";
    }
    if (*(int *)((long)&in_RSI->bidders[3].bid + 4) == 0) {
      tar_flush_unconsumed(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      p = (char *)__archive_read_ahead
                            (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                             (ssize_t *)0x162a10);
      if (((p != (char *)0x0) && (*p == '\0')) && (wVar1 = archive_block_is_null(p), wVar1 != L'\0')
         ) {
        __archive_read_consume(in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98);
      }
      archive_clear_error((archive *)in_RDI);
      return L'\x01';
    }
  }
  wVar1 = checksum((archive_read *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   a_00);
  if (wVar1 == L'\0') {
    tar_flush_unconsumed(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    archive_set_error((archive *)in_RDI,0x16,"Damaged tar archive");
    return L'\xfffffff6';
  }
  iVar2 = *(int *)((long)&in_RSI->bidders[0].data + 4) + 1;
  *(int *)((long)&in_RSI->bidders[0].data + 4) = iVar2;
  if (0x20 < iVar2) {
    tar_flush_unconsumed(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    archive_set_error((archive *)in_RDI,0x16,"Too many special headers");
    return L'\xffffffec';
  }
  unconsumed_00 = (size_t *)(ulong)((int)*(char *)((long)&a_00->read_data_offset + 4) - 0x41);
  switch(unconsumed_00) {
  case (size_t *)0x0:
    *(undefined4 *)&(in_RDI->acl_text).buffer_length = 0x30002;
    (in_RDI->entry_pathname).s = "Solaris tar";
    wVar1 = header_Solaris_ACL((archive_read *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               (archive_entry *)in_RSI,in_RDX,(size_t *)in_RCX);
    break;
  default:
    if (*(long *)((long)&(a_00->client).dataset + 1) == 0x20207261747375) {
      *(undefined4 *)&(in_RDI->acl_text).buffer_length = 0x30004;
      (in_RDI->entry_pathname).s = "GNU tar format";
      wVar1 = header_gnutar(in_RCX,in_stack_ffffffffffffffd0,
                            (archive_entry *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),a_00,
                            (size_t *)a_00);
    }
    else {
      a_01 = a_00;
      h_00 = a_00;
      iVar2 = memcmp((void *)((long)&(a_00->client).dataset + 1),"ustar",5);
      if (iVar2 == 0) {
        if ((int)(in_RDI->acl_text).buffer_length != 0x30002) {
          *(undefined4 *)&(in_RDI->acl_text).buffer_length = 0x30001;
          (in_RDI->entry_pathname).s = "POSIX ustar format";
        }
        wVar1 = header_ustar(in_RCX,in_stack_ffffffffffffffd0,
                             (archive_entry *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),h_00);
      }
      else {
        *(undefined4 *)&(in_RDI->acl_text).buffer_length = 0x30000;
        (in_RDI->entry_pathname).s = "tar (non-POSIX)";
        wVar1 = header_old_tar(a_01,(tar *)a_00,
                               (archive_entry *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               in_stack_ffffffffffffffa0);
      }
    }
    break;
  case (size_t *)0xa:
    wVar1 = header_longlink(a_00,(tar *)in_stack_ffffffffffffffb0,
                            (archive_entry *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffa0,unconsumed_00);
    break;
  case (size_t *)0xb:
    wVar1 = header_longname(a_00,(tar *)in_stack_ffffffffffffffb0,
                            (archive_entry *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffa0,unconsumed_00);
    break;
  case (size_t *)0x15:
    wVar1 = header_volume(in_stack_ffffffffffffffb0,
                          (tar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (archive_entry *)in_stack_ffffffffffffffa0,unconsumed_00,
                          (size_t *)0x162c3b);
    break;
  case (size_t *)0x17:
    *(undefined4 *)&(in_RDI->acl_text).buffer_length = 0x30002;
    (in_RDI->entry_pathname).s = "POSIX pax interchange format (Sun variant)";
    wVar1 = header_pax_extensions
                      ((archive_read *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                       ,(tar *)a_00,(archive_entry *)a_00,in_stack_ffffffffffffffb0,
                       (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    break;
  case (size_t *)0x26:
    *(undefined4 *)&(in_RDI->acl_text).buffer_length = 0x30002;
    (in_RDI->entry_pathname).s = "POSIX pax interchange format";
    wVar1 = header_pax_global(a_00,(tar *)in_stack_ffffffffffffffb0,
                              (archive_entry *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              in_stack_ffffffffffffffa0,unconsumed_00);
    if (wVar1 == L'\x01') {
      return L'\x01';
    }
    break;
  case (size_t *)0x37:
    *(undefined4 *)&(in_RDI->acl_text).buffer_length = 0x30002;
    (in_RDI->entry_pathname).s = "POSIX pax interchange format";
    wVar1 = header_pax_extensions
                      ((archive_read *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                       ,(tar *)a_00,(archive_entry *)a_00,in_stack_ffffffffffffffb0,
                       (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (wVar1 == L'\xffffffe2') {
    return L'\xffffffe2';
  }
  tar_flush_unconsumed(in_stack_ffffffffffffffa0,unconsumed_00);
  *(int *)((long)&in_RSI->bidders[0].data + 4) = *(int *)((long)&in_RSI->bidders[0].data + 4) + -1;
  if ((((wVar1 == L'\xffffffec') || (wVar1 == L'\0')) &&
      (*(int *)((long)&in_RSI->bidders[0].data + 4) == 0)) &&
     ((*(int *)&in_RSI->bidders[3].bid != 0 &&
      (wVar3 = read_mac_metadata_blob
                         (in_RSI,in_RDX,(archive_entry *)in_RCX,in_stack_ffffffffffffffd0,
                          (size_t *)CONCAT44(wVar1,in_stack_ffffffffffffffc8)), wVar3 < wVar1)))) {
    wVar1 = wVar3;
  }
  if ((wVar1 != L'\xffffffec') && (wVar1 != L'\0')) {
    if (wVar1 == L'\x01') {
      archive_set_error((archive *)in_RDI,0x16,"Damaged tar archive");
    }
    return L'\xffffffe2';
  }
  if (*(char *)&in_RSI->bidders[1].free == '\0') {
    return wVar1;
  }
  if ((*(int *)&in_RSI->bidders[1].options == 1) &&
     (*(int *)((long)&in_RSI->bidders[1].options + 4) == 0)) {
    *(undefined1 *)&in_RSI->bidders[1].free = 0;
    sVar4 = gnu_sparse_10_read(in_RCX,in_stack_ffffffffffffffd0,
                               (size_t *)CONCAT44(wVar1,in_stack_ffffffffffffffc8));
    in_RSI->bidders[0].name = in_RSI->bidders[0].name + -sVar4;
    if (-1 < sVar4) {
      *(undefined1 *)&in_RSI->bidders[1].free = 0;
      return wVar1;
    }
    return (wchar_t)sVar4;
  }
  archive_set_error((archive *)in_RDI,-1,"Unrecognized GNU sparse file format");
  return L'\xffffffec';
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err;
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Loop until we find a workable header record. */
	for (;;) {
		tar_flush_unconsumed(a, unconsumed);

		/* Read 512-byte header record */
		h = __archive_read_ahead(a, 512, &bytes);
		if (bytes < 0)
			return ((int)bytes);
		if (bytes == 0) { /* EOF at a block boundary. */
			/* Some writers do omit the block of nulls. <sigh> */
			return (ARCHIVE_EOF);
		}
		if (bytes < 512) {  /* Short block at EOF; this is bad. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated tar archive");
			return (ARCHIVE_FATAL);
		}
		*unconsumed = 512;

		/* Header is workable if it's not an end-of-archive mark. */
		if (h[0] != 0 || !archive_block_is_null(h))
			break;

		/* Ensure format is set for archives with only null blocks. */
		if (a->archive.archive_format_name == NULL) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar";
		}

		if (!tar->read_concatenated_archives) {
			/* Try to consume a second all-null record, as well. */
			tar_flush_unconsumed(a, unconsumed);
			h = __archive_read_ahead(a, 512, NULL);
			if (h != NULL && h[0] == 0 && archive_block_is_null(h))
				__archive_read_consume(a, 512);
			archive_clear_error(&a->archive);
			return (ARCHIVE_EOF);
		}

		/*
		 * We're reading concatenated archives, ignore this block and
		 * loop to get the next.
		 */
	}

	/*
	 * Note: If the checksum fails and we return ARCHIVE_RETRY,
	 * then the client is likely to just retry.  This is a very
	 * crude way to search for the next valid header!
	 *
	 * TODO: Improve this by implementing a real header scan.
	 */
	if (!checksum(a, h)) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
		return (ARCHIVE_RETRY); /* Retryable: Invalid header */
	}

	if (++tar->header_recursion_depth > 32) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Too many special headers");
		return (ARCHIVE_WARN);
	}

	/* Determine the format variant. */
	header = (const struct archive_entry_header_ustar *)h;

	switch(header->typeflag[0]) {
	case 'A': /* Solaris tar ACL */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "Solaris tar";
		err = header_Solaris_ACL(a, tar, entry, h, unconsumed);
		break;
	case 'g': /* POSIX-standard 'g' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_global(a, tar, entry, h, unconsumed);
		if (err == ARCHIVE_EOF)
			return (err);
		break;
	case 'K': /* Long link name (GNU tar, others) */
		err = header_longlink(a, tar, entry, h, unconsumed);
		break;
	case 'L': /* Long filename (GNU tar, others) */
		err = header_longname(a, tar, entry, h, unconsumed);
		break;
	case 'V': /* GNU volume header */
		err = header_volume(a, tar, entry, h, unconsumed);
		break;
	case 'X': /* Used by SUN tar; same as 'x'. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name =
		    "POSIX pax interchange format (Sun variant)";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	case 'x': /* POSIX-standard 'x' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	default:
		gnuheader = (const struct archive_entry_header_gnutar *)h;
		if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
			a->archive.archive_format_name = "GNU tar format";
			err = header_gnutar(a, tar, entry, h, unconsumed);
		} else if (memcmp(header->magic, "ustar", 5) == 0) {
			if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
				a->archive.archive_format_name = "POSIX ustar format";
			}
			err = header_ustar(a, tar, entry, h);
		} else {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar (non-POSIX)";
			err = header_old_tar(a, tar, entry, h);
		}
	}
	if (err == ARCHIVE_FATAL)
		return (err);

	tar_flush_unconsumed(a, unconsumed);

	h = NULL;
	header = NULL;

	--tar->header_recursion_depth;
	/* Yuck.  Apple's design here ends up storing long pathname
	 * extensions for both the AppleDouble extension entry and the
	 * regular entry.
	 */
	if ((err == ARCHIVE_WARN || err == ARCHIVE_OK) &&
	    tar->header_recursion_depth == 0 &&
	    tar->process_mac_extensions) {
		int err2 = read_mac_metadata_blob(a, tar, entry, h, unconsumed);
		if (err2 < err)
			err = err2;
	}

	/* We return warnings or success as-is.  Anything else is fatal. */
	if (err == ARCHIVE_WARN || err == ARCHIVE_OK) {
		if (tar->sparse_gnu_pending) {
			if (tar->sparse_gnu_major == 1 &&
			    tar->sparse_gnu_minor == 0) {
				ssize_t bytes_read;

				tar->sparse_gnu_pending = 0;
				/* Read initial sparse map. */
				bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
				tar->entry_bytes_remaining -= bytes_read;
				if (bytes_read < 0)
					return ((int)bytes_read);
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unrecognized GNU sparse file format");
				return (ARCHIVE_WARN);
			}
			tar->sparse_gnu_pending = 0;
		}
		return (err);
	}
	if (err == ARCHIVE_EOF)
		/* EOF when recursively reading a header is bad. */
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
	return (ARCHIVE_FATAL);
}